

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O2

int EmitAlphaRGBA4444(VP8Io *io,WebPDecParams *p,int expected_num_lines_out)

{
  byte bVar1;
  uint uVar2;
  WEBP_CSP_MODE WVar3;
  WebPDecBuffer *pWVar4;
  uint8_t *puVar5;
  int iVar6;
  long lVar7;
  uint8_t *puVar8;
  long lVar9;
  ulong uVar10;
  uint8_t *puVar11;
  ulong uVar12;
  int iVar13;
  byte bVar14;
  uint8_t *local_40;
  int num_rows;
  
  local_40 = io->a;
  if (local_40 != (uint8_t *)0x0) {
    uVar2 = io->mb_w;
    pWVar4 = p->output;
    WVar3 = pWVar4->colorspace;
    iVar6 = GetAlphaSourceRow(io,&local_40,&num_rows);
    puVar5 = (pWVar4->u).RGBA.rgba;
    lVar9 = (long)(pWVar4->u).RGBA.stride;
    lVar7 = iVar6 * lVar9;
    puVar8 = puVar5 + lVar7 + 1;
    iVar6 = 0;
    uVar12 = 0;
    if (0 < (int)uVar2) {
      uVar12 = (ulong)uVar2;
    }
    iVar13 = 0;
    if (0 < num_rows) {
      iVar13 = num_rows;
    }
    bVar14 = 0xf;
    puVar11 = local_40;
    for (; iVar6 != iVar13; iVar6 = iVar6 + 1) {
      for (uVar10 = 0; uVar12 != uVar10; uVar10 = uVar10 + 1) {
        bVar1 = puVar11[uVar10];
        puVar8[uVar10 * 2] = puVar8[uVar10 * 2] & 0xf0 | bVar1 >> 4;
        bVar14 = bVar14 & bVar1 >> 4;
      }
      puVar11 = puVar11 + io->width;
      lVar9 = (long)(pWVar4->u).RGBA.stride;
      puVar8 = puVar8 + lVar9;
    }
    if ((bVar14 != 0xf) && (0xfffffffb < WVar3 - MODE_YUV)) {
      (*WebPApplyAlphaMultiply4444)(puVar5 + lVar7,uVar2,num_rows,(int)lVar9);
    }
  }
  return 0;
}

Assistant:

static int EmitAlphaRGBA4444(const VP8Io* const io, WebPDecParams* const p,
                             int expected_num_lines_out) {
  const uint8_t* alpha = io->a;
  if (alpha != NULL) {
    const int mb_w = io->mb_w;
    const WEBP_CSP_MODE colorspace = p->output->colorspace;
    const WebPRGBABuffer* const buf = &p->output->u.RGBA;
    int num_rows;
    const int start_y = GetAlphaSourceRow(io, &alpha, &num_rows);
    uint8_t* const base_rgba = buf->rgba + (ptrdiff_t)start_y * buf->stride;
#if (WEBP_SWAP_16BIT_CSP == 1)
    uint8_t* alpha_dst = base_rgba;
#else
    uint8_t* alpha_dst = base_rgba + 1;
#endif
    uint32_t alpha_mask = 0x0f;
    int i, j;
    for (j = 0; j < num_rows; ++j) {
      for (i = 0; i < mb_w; ++i) {
        // Fill in the alpha value (converted to 4 bits).
        const uint32_t alpha_value = alpha[i] >> 4;
        alpha_dst[2 * i] = (alpha_dst[2 * i] & 0xf0) | alpha_value;
        alpha_mask &= alpha_value;
      }
      alpha += io->width;
      alpha_dst += buf->stride;
    }
    (void)expected_num_lines_out;
    assert(expected_num_lines_out == num_rows);
    if (alpha_mask != 0x0f && WebPIsPremultipliedMode(colorspace)) {
      WebPApplyAlphaMultiply4444(base_rgba, mb_w, num_rows, buf->stride);
    }
  }
  return 0;
}